

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLib.h
# Opt level: O0

SC_Timing * Scl_CellPinTime(SC_Cell *pCell,int iPin)

{
  int iVar1;
  SC_Pin *pSVar2;
  void *pvVar3;
  SC_Timings *pRTime;
  SC_Pin *pPin;
  int iPin_local;
  SC_Cell *pCell_local;
  
  if ((-1 < iPin) && (iPin < pCell->n_inputs)) {
    pSVar2 = SC_CellPin(pCell,pCell->n_inputs);
    iVar1 = Vec_PtrSize(&pSVar2->vRTimings);
    if (iVar1 != pCell->n_inputs) {
      __assert_fail("Vec_PtrSize(&pPin->vRTimings) == pCell->n_inputs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLib.h"
                    ,0x290,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
    }
    pvVar3 = Vec_PtrEntry(&pSVar2->vRTimings,iPin);
    iVar1 = Vec_PtrSize((Vec_Ptr_t *)((long)pvVar3 + 8));
    if (iVar1 == 0) {
      pCell_local = (SC_Cell *)0x0;
    }
    else {
      iVar1 = Vec_PtrSize((Vec_Ptr_t *)((long)pvVar3 + 8));
      if (iVar1 != 1) {
        __assert_fail("Vec_PtrSize(&pRTime->vTimings) == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLib.h"
                      ,0x294,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
      }
      pCell_local = (SC_Cell *)Vec_PtrEntry((Vec_Ptr_t *)((long)pvVar3 + 8),0);
    }
    return (SC_Timing *)pCell_local;
  }
  __assert_fail("iPin >= 0 && iPin < pCell->n_inputs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLib.h"
                ,0x28e,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
}

Assistant:

static inline SC_Timing * Scl_CellPinTime( SC_Cell * pCell, int iPin )
{
    SC_Pin * pPin;
    SC_Timings * pRTime;
    assert( iPin >= 0 && iPin < pCell->n_inputs );
    pPin = SC_CellPin( pCell, pCell->n_inputs );
    assert( Vec_PtrSize(&pPin->vRTimings) == pCell->n_inputs );
    pRTime = (SC_Timings *)Vec_PtrEntry( &pPin->vRTimings, iPin );
    if ( Vec_PtrSize(&pRTime->vTimings) == 0 )
        return NULL;
    assert( Vec_PtrSize(&pRTime->vTimings) == 1 );
    return (SC_Timing *)Vec_PtrEntry( &pRTime->vTimings, 0 );
}